

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

int mqtt_client_unsubscribe
              (MQTT_CLIENT_HANDLE handle,uint16_t packetId,char **unsubscribeList,size_t count)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  STRING_HANDLE trace_log_00;
  BUFFER_HANDLE handle_00;
  size_t length;
  uchar *data;
  LOGGER_LOG l_2;
  size_t size;
  LOGGER_LOG l_1;
  BUFFER_HANDLE unsubPacket;
  STRING_HANDLE trace_log;
  LOGGER_LOG l;
  MQTT_CLIENT *mqtt_client;
  int result;
  size_t count_local;
  char **unsubscribeList_local;
  uint16_t packetId_local;
  MQTT_CLIENT_HANDLE handle_local;
  
  if ((((handle == (MQTT_CLIENT_HANDLE)0x0) || (unsubscribeList == (char **)0x0)) || (count == 0))
     || (packetId == 0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                ,"mqtt_client_unsubscribe",0x4e9,1,
                "Invalid parameter specified mqtt_client: %p, unsubscribeList: %p, count: %lu, packetId: %d"
                ,handle,unsubscribeList,count,(uint)packetId);
    }
    mqtt_client._4_4_ = 0x4ea;
  }
  else {
    trace_log_00 = construct_trace_log_handle(handle);
    handle_00 = mqtt_codec_unsubscribe(packetId,unsubscribeList,count,trace_log_00);
    if (handle_00 == (BUFFER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                  ,"mqtt_client_unsubscribe",0x4f4,1,"Error: mqtt_codec_unsubscribe failed");
      }
      mqtt_client._4_4_ = 0x4f5;
    }
    else {
      handle->packetState = UNSUBSCRIBE_TYPE;
      length = BUFFER_length(handle_00);
      data = BUFFER_u_char(handle_00);
      iVar1 = sendPacketItem(handle,data,length);
      if (iVar1 == 0) {
        log_outgoing_trace(handle,trace_log_00);
        mqtt_client._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                    ,"mqtt_client_unsubscribe",0x500,1,"Error: mqtt_client_unsubscribe send failed")
          ;
        }
        mqtt_client._4_4_ = 0x501;
      }
      BUFFER_delete(handle_00);
    }
    if (trace_log_00 != (STRING_HANDLE)0x0) {
      STRING_delete(trace_log_00);
    }
  }
  return mqtt_client._4_4_;
}

Assistant:

int mqtt_client_unsubscribe(MQTT_CLIENT_HANDLE handle, uint16_t packetId, const char** unsubscribeList, size_t count)
{
    int result;
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
    if (mqtt_client == NULL || unsubscribeList == NULL || count == 0 || packetId == 0)
    {
        /*Codes_SRS_MQTT_CLIENT_07_016: [If any of the parameters handle, unsubscribeList is NULL or count is 0 then mqtt_client_unsubscribe shall return a non-zero value.]*/
        LogError("Invalid parameter specified mqtt_client: %p, unsubscribeList: %p, count: %lu, packetId: %d", mqtt_client, unsubscribeList, (unsigned long)count, packetId);
        result = MU_FAILURE;
    }
    else
    {
        STRING_HANDLE trace_log = construct_trace_log_handle(mqtt_client);

        BUFFER_HANDLE unsubPacket = mqtt_codec_unsubscribe(packetId, unsubscribeList, count, trace_log);
        if (unsubPacket == NULL)
        {
            /*Codes_SRS_MQTT_CLIENT_07_017: [If any failure is encountered then mqtt_client_unsubscribe shall return a non-zero value.]*/
            LogError("Error: mqtt_codec_unsubscribe failed");
            result = MU_FAILURE;
        }
        else
        {
            mqtt_client->packetState = UNSUBSCRIBE_TYPE;

            size_t size = BUFFER_length(unsubPacket);
            /*Codes_SRS_MQTT_CLIENT_07_018: [On success mqtt_client_unsubscribe shall send the MQTT SUBCRIBE packet to the endpoint.]*/
            if (sendPacketItem(mqtt_client, BUFFER_u_char(unsubPacket), size) != 0)
            {
                /*Codes_SRS_MQTT_CLIENT_07_017: [If any failure is encountered then mqtt_client_unsubscribe shall return a non-zero value.].]*/
                LogError("Error: mqtt_client_unsubscribe send failed");
                result = MU_FAILURE;
            }
            else
            {
                log_outgoing_trace(mqtt_client, trace_log);
                result = 0;
            }
            BUFFER_delete(unsubPacket);
        }
        if (trace_log != NULL)
        {
            STRING_delete(trace_log);
        }
    }
    return result;
}